

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out.c
# Opt level: O0

void ly_print_flush(ly_out *out)

{
  ly_out *out_local;
  
  switch(out->type) {
  case LY_OUT_FD:
    fsync((out->method).fd);
    break;
  case LY_OUT_FDSTREAM:
    lseek((out->method).fdstream.fd,0,2);
    fflush((FILE *)(out->method).f);
    break;
  case LY_OUT_FILE:
  case LY_OUT_FILEPATH:
    fflush((FILE *)(out->method).f);
    break;
  case LY_OUT_MEMORY:
  case LY_OUT_CALLBACK:
    break;
  case LY_OUT_ERROR:
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/out.c",0x228);
  }
  free(out->buffered);
  out->buf_len = 0;
  out->buf_size = 0;
  return;
}

Assistant:

LIBYANG_API_DEF void
ly_print_flush(struct ly_out *out)
{
    switch (out->type) {
    case LY_OUT_FDSTREAM:
        /* move the original file descriptor to the end of the output file */
        lseek(out->method.fdstream.fd, 0, SEEK_END);
        fflush(out->method.fdstream.f);
        break;
    case LY_OUT_FILEPATH:
    case LY_OUT_FILE:
        fflush(out->method.f);
        break;
    case LY_OUT_FD:
        fsync(out->method.fd);
        break;
    case LY_OUT_MEMORY:
    case LY_OUT_CALLBACK:
        /* nothing to do */
        break;
    case LY_OUT_ERROR:
        LOGINT(NULL);
    }

    free(out->buffered);
    out->buf_size = out->buf_len = 0;
}